

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ToPrimitiveFree(JSContext *ctx,JSValue val,int hint)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue func_obj;
  JSValue func_obj_00;
  uint uVar1;
  int iVar2;
  uint in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSAtom in_stack_0000000c;
  JSContext *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  JSValue arg;
  JSAtom atom;
  JSValue ret;
  JSValue method;
  JSAtom method_name;
  BOOL force_ordinary;
  int i;
  undefined8 in_stack_fffffffffffffeb8;
  JSContext *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  JSValueUnion in_stack_fffffffffffffed0;
  JSValue in_stack_fffffffffffffee0;
  JSContext *in_stack_fffffffffffffef0;
  JSValueUnion in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar4;
  int local_90;
  long lVar6;
  undefined1 in_stack_ffffffffffffff90 [16];
  JSValue JVar5;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  if ((int)in_RDX != -1) {
    JVar3.tag = in_RDX;
    JVar3.u.float64 = in_RSI.float64;
    return JVar3;
  }
  uVar1 = in_ECX & 0xffffffef;
  if ((in_ECX & 0x10) == 0) {
    JVar3 = JS_GetPropertyInternal
                      (in_stack_00000010,(JSValue)in_stack_00000028,in_stack_0000000c,
                       (JSValue)in_stack_00000018,method_name);
    iVar2 = JS_IsException(JVar3);
    lVar6 = in_stack_ffffffffffffff90._4_8_;
    if (iVar2 != 0) goto LAB_00159707;
    iVar2 = JS_IsUndefined(JVar3);
    if (iVar2 == 0) {
      iVar2 = JS_IsNull(JVar3);
      lVar6 = in_stack_ffffffffffffff90._4_8_;
      if (iVar2 == 0) {
        if (uVar1 == 0) {
          uVar4 = 0x48;
        }
        else if (uVar1 == 1) {
          uVar4 = 0x46;
        }
        else {
          uVar4 = 0x16;
        }
        JVar3 = JS_AtomToString(in_stack_fffffffffffffec0,
                                (JSAtom)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        func_obj.tag = (int64_t)JVar3.u.ptr;
        func_obj.u.float64 = in_stack_ffffffffffffff08.float64;
        this_obj.tag = in_stack_ffffffffffffff00;
        this_obj.u.float64 = in_stack_fffffffffffffef8.float64;
        JVar3 = JS_CallFree(in_stack_fffffffffffffef0,func_obj,this_obj,
                            in_stack_fffffffffffffee0.tag._4_4_,
                            (JSValue *)CONCAT44(uVar4,in_stack_ffffffffffffff30));
        v.u._4_4_ = uVar1;
        v.u.int32 = in_stack_fffffffffffffec8;
        v.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
        JS_FreeValue(in_stack_fffffffffffffec0,v);
        iVar2 = JS_IsException(JVar3);
        in_stack_fffffffffffffecc = uVar1;
        if (iVar2 == 0) {
          v_00.u._4_4_ = uVar1;
          v_00.u.int32 = in_stack_fffffffffffffec8;
          v_00.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
          JS_FreeValue(in_stack_fffffffffffffec0,v_00);
          if ((int)JVar3.tag != -1) {
            return JVar3;
          }
          v_01.u._4_4_ = uVar1;
          v_01.u.int32 = in_stack_fffffffffffffec8;
          v_01.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
          JS_FreeValue(in_stack_fffffffffffffec0,v_01);
          JVar3 = JS_ThrowTypeError(in_RDI,"toPrimitive");
          return JVar3;
        }
        goto LAB_00159707;
      }
    }
  }
  for (local_90 = 0; lVar6 = in_stack_ffffffffffffff90._4_8_, local_90 < 2; local_90 = local_90 + 1)
  {
    JVar3 = JS_GetPropertyInternal
                      (in_stack_00000010,(JSValue)in_stack_00000028,in_stack_0000000c,
                       (JSValue)in_stack_00000018,method_name);
    local_40 = JVar3.u;
    local_38 = (JSValueUnion)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    lVar6 = in_stack_ffffffffffffff90._4_8_;
    if (iVar2 != 0) goto LAB_00159707;
    iVar2 = JS_IsFunction(in_RDI,JVar3);
    if (iVar2 == 0) {
      v_04.u._4_4_ = in_stack_fffffffffffffecc;
      v_04.u.int32 = in_stack_fffffffffffffec8;
      v_04.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
      JS_FreeValue(in_stack_fffffffffffffec0,v_04);
    }
    else {
      func_obj_00.tag = in_stack_ffffffffffffff10;
      func_obj_00.u.float64 = in_stack_ffffffffffffff08.float64;
      this_obj_00.tag = in_stack_ffffffffffffff00;
      this_obj_00.u.float64 = local_38.float64;
      in_stack_fffffffffffffee0 =
           JS_CallFree((JSContext *)local_40.ptr,func_obj_00,this_obj_00,
                       in_stack_fffffffffffffee0.tag._4_4_,
                       (JSValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      iVar2 = JS_IsException(in_stack_fffffffffffffee0);
      lVar6 = in_stack_ffffffffffffff90._4_8_;
      if (iVar2 != 0) goto LAB_00159707;
      if ((int)in_stack_fffffffffffffee0.tag != -1) {
        v_02.u._4_4_ = in_stack_fffffffffffffecc;
        v_02.u.int32 = in_stack_fffffffffffffec8;
        v_02.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
        JS_FreeValue(in_stack_fffffffffffffec0,v_02);
        return in_stack_fffffffffffffee0;
      }
      v_03.u._4_4_ = in_stack_fffffffffffffecc;
      v_03.u.int32 = in_stack_fffffffffffffec8;
      v_03.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
      JS_FreeValue(in_stack_fffffffffffffec0,v_03);
    }
  }
  JVar3 = JS_ThrowTypeError(in_RDI,"toPrimitive");
  in_stack_fffffffffffffed0 = JVar3.u;
LAB_00159707:
  v_05.u._4_4_ = in_stack_fffffffffffffecc;
  v_05.u.int32 = in_stack_fffffffffffffec8;
  v_05.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
  JS_FreeValue(in_stack_fffffffffffffec0,v_05);
  JVar5.u.ptr = (void *)(lVar6 << 0x20);
  JVar5.tag = 6;
  return JVar5;
}

Assistant:

static JSValue JS_ToPrimitiveFree(JSContext *ctx, JSValue val, int hint)
{
    int i;
    BOOL force_ordinary;

    JSAtom method_name;
    JSValue method, ret;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return val;
    force_ordinary = hint & HINT_FORCE_ORDINARY;
    hint &= ~HINT_FORCE_ORDINARY;
    if (!force_ordinary) {
        method = JS_GetProperty(ctx, val, JS_ATOM_Symbol_toPrimitive);
        if (JS_IsException(method))
            goto exception;
        /* ECMA says *If exoticToPrim is not undefined* but tests in
           test262 use null as a non callable converter */
        if (!JS_IsUndefined(method) && !JS_IsNull(method)) {
            JSAtom atom;
            JSValue arg;
            switch(hint) {
            case HINT_STRING:
                atom = JS_ATOM_string;
                break;
            case HINT_NUMBER:
                atom = JS_ATOM_number;
                break;
            default:
            case HINT_NONE:
                atom = JS_ATOM_default;
                break;
            }
            arg = JS_AtomToString(ctx, atom);
            ret = JS_CallFree(ctx, method, val, 1, (JSValueConst *)&arg);
            JS_FreeValue(ctx, arg);
            if (JS_IsException(ret))
                goto exception;
            JS_FreeValue(ctx, val);
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT)
                return ret;
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "toPrimitive");
        }
    }
    if (hint != HINT_STRING)
        hint = HINT_NUMBER;
    for(i = 0; i < 2; i++) {
        if ((i ^ hint) == 0) {
            method_name = JS_ATOM_toString;
        } else {
            method_name = JS_ATOM_valueOf;
        }
        method = JS_GetProperty(ctx, val, method_name);
        if (JS_IsException(method))
            goto exception;
        if (JS_IsFunction(ctx, method)) {
            ret = JS_CallFree(ctx, method, val, 0, NULL);
            if (JS_IsException(ret))
                goto exception;
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
                JS_FreeValue(ctx, val);
                return ret;
            }
            JS_FreeValue(ctx, ret);
        } else {
            JS_FreeValue(ctx, method);
        }
    }
    JS_ThrowTypeError(ctx, "toPrimitive");
exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}